

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

int main(void)

{
  allocator<unsigned_char> *this;
  uint uVar1;
  uchar *puVar2;
  ostream *poVar3;
  void *pvVar4;
  runtime_error *prVar5;
  allocator<unsigned_char> local_4c1;
  uint32_t trueanswer;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8;
  undefined1 local_4b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvect;
  uint32_t trueanswerslice;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  undefined1 local_478 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvectslice;
  allocator local_449;
  string local_448 [8];
  string input;
  undefined1 local_424 [8];
  CyclicHash<unsigned_int,_unsigned_char> hf;
  
  hf.myr = 0;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,5,0x13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"ABCDE",&local_449);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_448);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,*puVar2);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_448);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,*puVar2);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_448);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,*puVar2);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_448);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,*puVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Hash value of ABCD is ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_424._0_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_480._M_current = (char *)std::__cxx11::string::begin();
  _trueanswerslice = (char *)std::__cxx11::string::begin();
  local_488 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&trueanswerslice,4);
  this = (allocator<unsigned_char> *)
         ((long)&charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_478,local_480,local_488,
             this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       CyclicHash<unsigned_int,unsigned_char>::
       hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                 ((CyclicHash<unsigned_int,unsigned_char> *)local_424,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_478);
  if ((uint)charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != local_424._0_4_) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"bug");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_448);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_424,*puVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Hash value of ABCDE is ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_424._0_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_4b8._M_current = (char *)std::__cxx11::string::begin();
  _trueanswer = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_4c1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4b0,local_4b8,_trueanswer,
             &local_4c1);
  std::allocator<unsigned_char>::~allocator(&local_4c1);
  uVar1 = CyclicHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                    ((CyclicHash<unsigned_int,unsigned_char> *)local_424,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
  if (uVar1 != local_424._0_4_) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"bug");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  hf.myr = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_478);
  std::__cxx11::string::~string(local_448);
  return hf.myr;
}

Assistant:

int main() {
  CyclicHash<> hf(5, 19);
  string input = "ABCDE";
  hf.eat(input[0]); // A
  hf.eat(input[1]); // B
  hf.eat(input[2]); // C
  hf.eat(input[3]); // D
  cout << "Hash value of ABCD is " << hf.hashvalue << endl;
  // we check the answer going the long way...
  const std::vector<unsigned char> charvectslice(input.begin(),
                                                 input.begin() + 4);
  uint32_t trueanswerslice = hf.hash(charvectslice);
  if (trueanswerslice != hf.hashvalue)
    throw runtime_error("bug");
  // we continue
  hf.eat(input[4]); // E
  cout << "Hash value of ABCDE is " << hf.hashvalue << endl;
  // we check the answer going the long way
  const std::vector<unsigned char> charvect(input.begin(), input.end());
  uint32_t trueanswer = hf.hash(charvect);
  if (trueanswer != hf.hashvalue)
    throw runtime_error("bug");
  return 0;
}